

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::AssertHelper::operator=(AssertHelper *this,Message *message)

{
  Type result_type;
  int line_number;
  AssertHelperData *pAVar1;
  char *file_name;
  UnitTest *this_00;
  UnitTest *this_01;
  UnitTestImpl *this_02;
  long in_FS_OFFSET;
  Message *message_local;
  AssertHelper *this_local;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = UnitTest::GetInstance();
  pAVar1 = this->data_;
  result_type = pAVar1->type;
  file_name = pAVar1->file;
  line_number = pAVar1->line;
  AppendUserMessage(&local_30,&pAVar1->message,message);
  this_01 = UnitTest::GetInstance();
  this_02 = UnitTest::impl(this_01);
  UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_((string *)&this_local,this_02,1);
  UnitTest::AddTestPartResult
            (this_00,result_type,file_name,line_number,&local_30,(string *)&this_local);
  std::__cxx11::string::~string((string *)&this_local);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AssertHelper::operator=(const Message& message) const {
  UnitTest::GetInstance()->
    AddTestPartResult(data_->type, data_->file, data_->line,
                      AppendUserMessage(data_->message, message),
                      UnitTest::GetInstance()->impl()
                      ->CurrentOsStackTraceExceptTop(1)
                      // Skips the stack frame for this function itself.
                      );  // NOLINT
}